

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int open_get_outgoing_locales(OPEN_HANDLE open,AMQP_VALUE *outgoing_locales_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  AMQP_VALUE pAVar4;
  bool bVar5;
  uint32_t item_count;
  ietf_language_tag outgoing_locales_single_value;
  
  if (open == (OPEN_HANDLE)0x0) {
    iVar3 = 0x60a;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(open->composite_value,&item_count);
    iVar3 = 0x612;
    if ((iVar1 == 0) && (iVar3 = 0x618, 5 < item_count)) {
      pAVar4 = amqpvalue_get_composite_item_in_place(open->composite_value,5);
      iVar3 = 0x620;
      if ((pAVar4 != (AMQP_VALUE)0x0) &&
         (AVar2 = amqpvalue_get_type(pAVar4), AVar2 != AMQP_TYPE_NULL)) {
        AVar2 = amqpvalue_get_type(pAVar4);
        if (AVar2 == AMQP_TYPE_ARRAY) {
          outgoing_locales_single_value = (ietf_language_tag)0x0;
          bVar5 = true;
        }
        else {
          iVar3 = amqpvalue_get_symbol(pAVar4,&outgoing_locales_single_value);
          bVar5 = iVar3 != 0;
        }
        AVar2 = amqpvalue_get_type(pAVar4);
        if (AVar2 == AMQP_TYPE_ARRAY) {
          iVar3 = amqpvalue_get_array(pAVar4,outgoing_locales_value);
          if ((bool)(iVar3 != 0 & bVar5)) {
            return 0x633;
          }
        }
        else if (bVar5) {
          return 0x633;
        }
        AVar2 = amqpvalue_get_type(pAVar4);
        iVar3 = 0;
        if (AVar2 != AMQP_TYPE_ARRAY) {
          pAVar4 = amqpvalue_create_array();
          *outgoing_locales_value = pAVar4;
          if (pAVar4 == (AMQP_VALUE)0x0) {
            iVar3 = 0x63c;
          }
          else {
            pAVar4 = amqpvalue_create_symbol(outgoing_locales_single_value);
            if (pAVar4 == (AMQP_VALUE)0x0) {
              iVar3 = 0x643;
            }
            else {
              iVar1 = amqpvalue_add_array_item(*outgoing_locales_value,pAVar4);
              iVar3 = 0x649;
              if (iVar1 == 0) {
                iVar1 = amqpvalue_set_composite_item
                                  (open->composite_value,5,*outgoing_locales_value);
                iVar3 = 0x64f;
                if (iVar1 == 0) {
                  iVar3 = 0;
                }
              }
              amqpvalue_destroy(pAVar4);
            }
            amqpvalue_destroy(*outgoing_locales_value);
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int open_get_outgoing_locales(OPEN_HANDLE open, AMQP_VALUE* outgoing_locales_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        if (amqpvalue_get_composite_item_count(open_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 5)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(open_instance->composite_value, 5);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    ietf_language_tag outgoing_locales_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_ietf_language_tag(item_value, &outgoing_locales_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&outgoing_locales_single_value, 0, sizeof(outgoing_locales_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, outgoing_locales_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *outgoing_locales_value = amqpvalue_create_array();
                            if (*outgoing_locales_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_ietf_language_tag(outgoing_locales_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*outgoing_locales_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(open_instance->composite_value, 5, *outgoing_locales_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*outgoing_locales_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}